

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O0

void test_convert<unsigned_short,float>(uint length,unsigned_short value)

{
  bool bVar1;
  unsigned_short *__p;
  float *__p_00;
  element_type *pDst;
  element_type *pDst_00;
  undefined8 *puVar2;
  uint local_54;
  uint i;
  float *u;
  unsigned_short *t;
  undefined1 local_30 [8];
  shared_ptr<float> pu;
  shared_ptr<unsigned_short> pt;
  unsigned_short value_local;
  uint length_local;
  
  __p = nosimd::common::malloc<unsigned_short>(length);
  std::shared_ptr<unsigned_short>::shared_ptr<unsigned_short,void(*)(unsigned_short*),void>
            ((shared_ptr<unsigned_short> *)
             &pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p,
             nosimd::common::free<unsigned_short>);
  __p_00 = nosimd::common::malloc<float>(length);
  std::shared_ptr<float>::shared_ptr<float,void(*)(float*),void>
            ((shared_ptr<float> *)local_30,__p_00,nosimd::common::free<float>);
  pDst = std::__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2> *)
                    &pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pDst_00 = std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  sse::common::set<unsigned_short>(value,pDst,length);
  sse::common::convert<unsigned_short,float>(pDst,pDst_00,length);
  local_54 = 0;
  while( true ) {
    if (length <= local_54) {
      std::shared_ptr<float>::~shared_ptr((shared_ptr<float> *)local_30);
      std::shared_ptr<unsigned_short>::~shared_ptr
                ((shared_ptr<unsigned_short> *)
                 &pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    bVar1 = anon_unknown.dwarf_942e::equal<float>(pDst_00[local_54],(float)value);
    if (!bVar1) break;
    local_54 = local_54 + 1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = "void test_convert(unsigned int, _T) [_T = unsigned short, _U = float]";
  *(undefined4 *)(puVar2 + 1) = 0x17;
  *(uint *)((long)puVar2 + 0xc) = length;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}